

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::extractBits(APInt *this,uint numBits,uint bitPosition)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t *__dest;
  uint in_ECX;
  int iVar3;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  uint uVar4;
  undefined4 in_register_00000034;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  anon_union_8_2_1313ab2f_for_U aVar11;
  ArrayRef<unsigned_long> bigVal;
  APInt AVar12;
  APInt Result;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  ulong local_38;
  ulong extraout_RDX_01;
  
  puVar5 = (ulong *)CONCAT44(in_register_00000034,numBits);
  if (bitPosition == 0) {
    __assert_fail("numBits > 0 && \"Can\'t extract zero bits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x194,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
  }
  uVar4 = (uint)puVar5[1];
  if ((uVar4 <= in_ECX) || (uVar4 < in_ECX + bitPosition)) {
    __assert_fail("bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth && \"Illegal bit extraction\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x196,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
  }
  if (uVar4 < 0x41) {
    uVar1 = *puVar5;
    uVar4 = in_ECX;
  }
  else {
    uVar4 = in_ECX & 0x3f;
    uVar10 = in_ECX >> 6;
    iVar3 = ((in_ECX + bitPosition) - 1 >> 6) - uVar10;
    if (iVar3 != 0) {
      if (uVar4 == 0) {
        bigVal.Length._0_4_ = iVar3 + 1;
        bigVal.Data = (unsigned_long *)((ulong)(uVar10 << 3) + *puVar5);
        bigVal.Length._4_4_ = 0;
        APInt(this,bitPosition,bigVal);
        uVar1 = extraout_RDX_01;
      }
      else {
        APInt((APInt *)&local_48,bitPosition,0,false);
        uVar2 = (ulong)local_40;
        local_38 = uVar2 + 0x3f;
        aVar11.pVal = (uint64_t *)&local_48;
        if (0x40 < uVar2) {
          aVar11 = local_48;
        }
        uVar6 = local_38 >> 6;
        uVar1 = extraout_RDX_00;
        if (uVar2 != 0) {
          uVar2 = puVar5[1];
          uVar1 = (ulong)(0x40 - uVar4);
          uVar7 = (ulong)uVar10;
          uVar8 = uVar6;
          do {
            uVar7 = uVar7 + 1;
            if (uVar7 < (ulong)(uint)uVar2 + 0x3f >> 6) {
              lVar9 = *(long *)(*puVar5 + uVar7 * 8);
            }
            else {
              lVar9 = 0;
            }
            *aVar11.pVal = lVar9 << ((byte)(0x40 - uVar4) & 0x3f) |
                           *(ulong *)((*puVar5 - 8) + uVar7 * 8) >> (sbyte)uVar4;
            aVar11.pVal = (uint64_t *)(aVar11.VAL + 8);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar2 = 0xffffffffffffffff >> (-(char)local_40 & 0x3fU);
        if (local_40 < 0x41) {
          local_48.VAL = local_48.VAL & uVar2;
        }
        else {
          local_48.pVal[(int)uVar6 - 1] = local_48.pVal[(int)uVar6 - 1] & uVar2;
        }
        this->BitWidth = local_40;
        if (local_40 < 0x41) {
          (this->U).pVal = (uint64_t *)local_48;
        }
        else {
          uVar1 = (ulong)((uint)(local_38 >> 3) & 0xfffffff8);
          __dest = (uint64_t *)operator_new__(uVar1);
          (this->U).pVal = __dest;
          memcpy(__dest,local_48.pVal,uVar1);
          uVar1 = extraout_RDX_02;
          if ((uint64_t *)local_48.VAL != (uint64_t *)0x0) {
            operator_delete__(local_48.pVal);
            uVar1 = extraout_RDX_03;
          }
        }
      }
      goto LAB_0017da7d;
    }
    uVar1 = *(ulong *)(*puVar5 + (ulong)uVar10 * 8);
  }
  APInt(this,bitPosition,uVar1 >> ((byte)uVar4 & 0x3f),false);
  uVar1 = extraout_RDX;
LAB_0017da7d:
  AVar12._8_8_ = uVar1;
  AVar12.U.pVal = (uint64_t *)this;
  return AVar12;
}

Assistant:

APInt APInt::extractBits(unsigned numBits, unsigned bitPosition) const {
  assert(numBits > 0 && "Can't extract zero bits");
  assert(bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth &&
         "Illegal bit extraction");

  if (isSingleWord())
    return APInt(numBits, U.VAL >> bitPosition);

  unsigned loBit = whichBit(bitPosition);
  unsigned loWord = whichWord(bitPosition);
  unsigned hiWord = whichWord(bitPosition + numBits - 1);

  // Single word result extracting bits from a single word source.
  if (loWord == hiWord)
    return APInt(numBits, U.pVal[loWord] >> loBit);

  // Extracting bits that start on a source word boundary can be done
  // as a fast memory copy.
  if (loBit == 0)
    return APInt(numBits, makeArrayRef(U.pVal + loWord, 1 + hiWord - loWord));

  // General case - shift + copy source words directly into place.
  APInt Result(numBits, 0);
  unsigned NumSrcWords = getNumWords();
  unsigned NumDstWords = Result.getNumWords();

  uint64_t *DestPtr = Result.isSingleWord() ? &Result.U.VAL : Result.U.pVal;
  for (unsigned word = 0; word < NumDstWords; ++word) {
    uint64_t w0 = U.pVal[loWord + word];
    uint64_t w1 =
        (loWord + word + 1) < NumSrcWords ? U.pVal[loWord + word + 1] : 0;
    DestPtr[word] = (w0 >> loBit) | (w1 << (APINT_BITS_PER_WORD - loBit));
  }

  return Result.clearUnusedBits();
}